

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O3

void __thiscall
S2RegionCoverer::AdjustCellLevels
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *cells)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  pointer pSVar4;
  uint64 *puVar5;
  long lVar6;
  S2RegionCoverer *pSVar7;
  bool bVar8;
  int iVar9;
  pointer pSVar10;
  pointer pSVar11;
  int iVar12;
  uint uVar13;
  pointer pSVar14;
  uint uVar15;
  ulong __new_size;
  S2CellId id;
  S2CellId local_58;
  S2RegionCoverer *local_50;
  pointer local_48;
  S2LogMessage local_40;
  
  pSVar14 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar11 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pSVar10 = pSVar14;
  pSVar4 = pSVar14;
  if (pSVar14 != pSVar11) {
    do {
      pSVar10 = pSVar4 + 1;
      if (pSVar10 == pSVar11) goto LAB_0021ca81;
      puVar5 = &pSVar4->id_;
      pSVar4 = pSVar10;
    } while (*puVar5 <= pSVar10->id_);
  }
  if (pSVar10 != pSVar11) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0xc5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: is_sorted(cells->begin(), cells->end()) ",0x36);
LAB_0021cbbc:
    abort();
  }
LAB_0021ca81:
  if ((this->options_).level_mod_ != 1) {
    __new_size = 0;
    pSVar7 = this;
    if (pSVar14 != pSVar11) {
      do {
        local_48 = pSVar11;
        local_50 = pSVar7;
        local_58.id_ = pSVar14->id_;
        if (local_58.id_ == 0) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                     ,0x223,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: id_ != 0 ",0x17);
          goto LAB_0021cbbc;
        }
        iVar1 = (this->options_).level_mod_;
        if (1 < iVar1) {
          uVar3 = 0;
          if (local_58.id_ != 0) {
            for (; (local_58.id_ >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          iVar12 = 0x1e - ((uint)(uVar3 >> 1) & 0x7fffffff);
          iVar2 = (this->options_).min_level_;
          iVar9 = iVar12 - iVar2;
          if ((iVar9 != 0 && iVar2 <= iVar12) && (iVar9 = iVar9 % iVar1, iVar9 != 0)) {
            local_58 = S2CellId::parent(&local_58,iVar12 - iVar9);
          }
        }
        uVar15 = (uint)__new_size;
        if (((int)uVar15 < 1) ||
           (bVar8 = S2CellId::contains((cells->
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>).
                                       _M_impl.super__Vector_impl_data._M_start + (__new_size - 1),
                                       local_58), !bVar8)) {
          uVar13 = (int)uVar15 >> 0x1f & uVar15;
          uVar15 = uVar15 + 1;
          do {
            pSVar11 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if ((int)__new_size < 1) goto LAB_0021cb40;
            lVar6 = __new_size - 1;
            __new_size = __new_size - 1;
            bVar8 = S2CellId::contains(&local_58,(S2CellId)pSVar11[lVar6].id_);
            uVar15 = uVar15 - 1;
          } while (bVar8);
          pSVar11 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = uVar15;
LAB_0021cb40:
          __new_size = (ulong)(uVar13 + 1);
          pSVar11[(int)uVar13].id_ = local_58.id_;
          this = local_50;
        }
        pSVar14 = pSVar14 + 1;
        pSVar7 = local_50;
        pSVar11 = local_48;
      } while (pSVar14 != local_48);
      __new_size = (ulong)(int)__new_size;
    }
    std::vector<S2CellId,_std::allocator<S2CellId>_>::resize(cells,__new_size);
  }
  return;
}

Assistant:

void S2RegionCoverer::AdjustCellLevels(vector<S2CellId>* cells) const {
  S2_DCHECK(is_sorted(cells->begin(), cells->end()));
  if (options_.level_mod() == 1) return;

  int out = 0;
  for (S2CellId id : *cells) {
    int level = id.level();
    int new_level = AdjustLevel(level);
    if (new_level != level) id = id.parent(new_level);
    if (out > 0 && (*cells)[out-1].contains(id)) continue;
    while (out > 0 && id.contains((*cells)[out-1])) --out;
    (*cells)[out++] = id;
  }
  cells->resize(out);
}